

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O1

CHog * __thiscall CHog::visualizationHalf(CHog *this,Mat *image)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  _OutputArray *in_RDX;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  double dVar15;
  int local_bc;
  ulong local_b8;
  _InputArray local_a8;
  undefined8 uStack_90;
  CHog *local_80;
  double local_78;
  undefined8 local_70;
  CHog *local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined4 local_48;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"visualization",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
  std::ostream::put(-0x18);
  std::ostream::flush();
  cv::Mat::Mat((Mat *)this,*(int *)(image + 0x1c) * *(int *)(image + 0x20),
               *(int *)(image + 0x20) * *(int *)(image + 0x18),0x10);
  if ((in_RDX->super__InputArray).sz == (Size)0x0) {
    local_a8.obj = &local_70;
    local_70 = 0;
    local_a8.flags = -0x3efdfffa;
    local_a8.sz.width = 1;
    local_a8.sz.height = 1;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)this,&local_a8);
  }
  else {
    local_a8.sz.width = 0;
    local_a8.sz.height = 0;
    local_a8.flags = 0x2010000;
    local_a8.obj = this;
    cv::Mat::copyTo(in_RDX);
  }
  if ((int)*(uint *)(image + 0x1c) < 1) {
    dVar15 = -3.4028234663852886e+38;
  }
  else {
    uVar13 = 0xe0000000;
    uVar14 = 0xc7efffff;
    lVar8 = 1;
    do {
      if (*(int *)(image + 0x18) < 1) {
        dVar15 = (double)CONCAT44(uVar14,uVar13);
      }
      else {
        lVar12 = *(long *)(*(long *)image + lVar8 * 8);
        uVar9 = 1;
        do {
          lVar10 = (long)*(int *)(lVar12 + 0x18 + uVar9 * 0x30);
          if (lVar10 < 1) {
            dVar15 = (double)CONCAT44(uVar14,uVar13);
          }
          else {
            lVar7 = 0;
            do {
              dVar15 = *(double *)(*(long *)(lVar12 + uVar9 * 0x30) + lVar7 * 8);
              if (dVar15 <= (double)CONCAT44(uVar14,uVar13)) {
                dVar15 = (double)CONCAT44(uVar14,uVar13);
              }
              lVar7 = lVar7 + 1;
              uVar13 = SUB84(dVar15,0);
              uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
            } while (lVar10 != lVar7);
          }
          uVar9 = uVar9 + 1;
          uVar13 = SUB84(dVar15,0);
          uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
        } while (uVar9 != *(int *)(image + 0x18) + 1);
      }
      lVar8 = lVar8 + 1;
      uVar13 = SUB84(dVar15,0);
      uVar14 = (undefined4)((ulong)dVar15 >> 0x20);
    } while (lVar8 != (ulong)*(uint *)(image + 0x1c) + 1);
  }
  if (0 < *(int *)(image + 0x1c)) {
    local_b8 = 1;
    local_80 = this;
    local_78 = dVar15;
    do {
      if (0 < *(int *)(image + 0x18)) {
        iVar6 = ((uint)(local_b8 >> 1) & 0x7fffffff) + ((int)local_b8 + -1) * *(int *)(image + 0x20)
        ;
        uVar9 = 1;
        do {
          lVar8 = *(long *)(*(long *)image + local_b8 * 8);
          lVar12 = uVar9 * 0x30;
          uVar1 = *(uint *)(lVar8 + 0x18 + lVar12);
          iVar11 = ((uint)(uVar9 >> 1) & 0x7fffffff) + ((int)uVar9 + -1) * *(int *)(image + 0x20);
          iVar4 = (int)((**(double **)(lVar8 + lVar12) / dVar15) * 255.0);
          local_38 = uVar9;
          if ((long)(int)uVar1 < 1) {
            local_bc = 0;
          }
          else {
            lVar8 = 0;
            local_bc = 0;
            do {
              iVar5 = (int)((*(double *)
                              (*(long *)(*(long *)(*(long *)image + local_b8 * 8) + lVar12) +
                              lVar8 * 8) / dVar15) * 255.0);
              iVar3 = (int)lVar8;
              if (iVar5 <= iVar4) {
                uStack_60 = 0;
                local_70 = CONCAT44(local_70._4_4_,0x3010000);
                local_68 = local_80;
                local_44 = *(int *)(image + 0x20) / 2;
                local_48 = 0;
                local_a8.obj = (void *)(double)iVar5;
                local_a8.flags = 0;
                local_a8._4_4_ = 0;
                uStack_90 = 0;
                local_a8.sz = (Size)local_a8.obj;
                local_40 = iVar11;
                local_3c = iVar6;
                cv::ellipse(SUB84((double)((int)lVar8 * (int)(0xb4 / (ulong)uVar1)),0),0,
                            0x4076800000000000,&local_70,&local_40,&local_48,&local_a8,0xffffffff,8,
                            0);
                dVar15 = local_78;
                iVar5 = iVar4;
                iVar3 = local_bc;
              }
              local_bc = iVar3;
              iVar4 = iVar5;
              lVar8 = lVar8 + 1;
            } while ((int)uVar1 != lVar8);
          }
          this = local_80;
          uStack_60 = 0;
          local_70 = CONCAT44(local_70._4_4_,0x3010000);
          local_68 = local_80;
          local_54 = *(int *)(image + 0x20) / 2;
          local_58 = 0;
          local_a8.obj = (void *)(double)iVar4;
          local_a8.flags = 0;
          local_a8._4_4_ = 0;
          uStack_90 = 0;
          local_a8.sz = (Size)local_a8.obj;
          local_50 = iVar11;
          local_4c = iVar6;
          cv::ellipse(SUB84((double)((int)(0xb4 / (long)(int)uVar1) * local_bc),0),0,
                      0x4076800000000000,&local_70,&local_50,&local_58,&local_a8,0xffffffff,8,0);
          uVar9 = local_38 + 1;
          dVar15 = local_78;
        } while ((long)local_38 < (long)*(int *)(image + 0x18));
      }
      bVar2 = (long)local_b8 < (long)*(int *)(image + 0x1c);
      local_b8 = local_b8 + 1;
    } while (bVar2);
  }
  return this;
}

Assistant:

cv::Mat CHog::visualizationHalf(cv::Mat image)
{
    cout<<"visualization"<<endl;
    cv::Mat visual(cellSize*numCellY, cellSize*numCellX, CV_8UC3);
    if(image.data!=NULL)
        image.copyTo(visual);
    else
        visual.setTo(0);
    double maxBinValue = -FLT_MAX;
    int pixValue;
    cv::Point start, end, center;
    int numOri, maxIdx, maxValue;
    for(int cellY = 1; cellY<numCellY+1; cellY++)
    {
        for(int cellX = 1; cellX<numCellX+1; cellX++)
        {
            numOri = hist[cellY][cellX].numOriHalf;
            for(int b = 0; b<numOri; b++)
                maxBinValue = hist[cellY][cellX].cellBinsHalf[b]>maxBinValue ? hist[cellY][cellX].cellBinsHalf[b] : maxBinValue;
        }
    }
    for(int cellY = 1; cellY<numCellY+1; cellY++)
    {
        center.y = (cellY-1) * cellSize + cellY/2;
        for(int cellX = 1; cellX<numCellX+1; cellX++)
        {
            numOri = hist[cellY][cellX].numOriHalf;
            maxIdx = 0;
            maxValue = hist[cellY][cellX].cellBinsHalf[0]/maxBinValue*255;
            center.x = (cellX-1) * cellSize + cellX/2;

            for(int b = 0; b<numOri; b++)
            {
                pixValue = hist[cellY][cellX].cellBinsHalf[b]/maxBinValue*255;
                if(pixValue>maxValue)
                {
                    maxValue = pixValue;
                    maxIdx = b;
                }
                else
                    cv::ellipse(visual, center, cv::Size(0, cellSize/2), b*(180/numOri), 0, 360, cv::Scalar(0, pixValue, pixValue), -1);
            }
            cv::ellipse(visual, center, cv::Size(0, cellSize/2), maxIdx*(180/numOri), 0, 360, cv::Scalar(0, maxValue, maxValue), -1);
            //cv::line(visual, cv::Point((cellX-1) * cellSize, 0), cv::Point((cellX-1) * cellSize, imgHeight), cv::Scalar(255,0,0));
        }
        //cv::line(visual, cv::Point(0, (cellY-1) * cellSize), cv::Point(imgWidth, (cellY-1) * cellSize), cv::Scalar(255,0,0));
    }
    return visual;
}